

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O2

void __thiscall
embree::sse2::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleM<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
::recreateMortonCodes
          (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleM<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
           *this,range<unsigned_int> *current)

{
  range<unsigned_int> rVar1;
  TriangleMesh *pTVar2;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  char cVar6;
  runtime_error *prVar7;
  size_t i;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  size_t i_1;
  ulong uVar11;
  undefined1 auVar12 [16];
  uint uVar13;
  float fVar14;
  uint uVar16;
  float fVar17;
  uint uVar18;
  float fVar19;
  undefined1 in_XMM2 [16];
  undefined1 auVar15 [16];
  float fVar20;
  undefined1 in_XMM4 [16];
  vfloat4 lower;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_128;
  anon_class_8_1_8991fb9c calculateCentBounds;
  anon_class_8_1_898bcfc2 local_110;
  blocked_range<unsigned_int> local_108;
  MortonCodeMapping mapping;
  BBox3fa centBounds;
  task_group_context context;
  
  uVar13 = current->_begin;
  uVar11 = (ulong)uVar13;
  uVar16 = current->_end;
  uVar9 = (ulong)uVar16;
  if (uVar16 - uVar13 < 0x400) {
    auVar12 = _DAT_01f45a30;
    auVar15 = _DAT_01f45a40;
    for (uVar8 = uVar11; uVar8 < uVar9; uVar8 = uVar8 + 1) {
      pTVar2 = this->calculateBounds->mesh;
      lVar10 = (ulong)this->morton[uVar8].field_0.field_0.index * *(long *)&pTVar2->field_0x68;
      lVar3 = *(long *)&(pTVar2->super_Geometry).field_0x58;
      pcVar4 = (pTVar2->vertices0).super_RawBufferView.ptr_ofs;
      sVar5 = (pTVar2->vertices0).super_RawBufferView.stride;
      in_XMM4 = *(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + 8 + lVar10) * sVar5);
      auVar21 = minps(*(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + lVar10) * sVar5),
                      *(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + 4 + lVar10) * sVar5));
      auVar22 = minps(auVar21,in_XMM4);
      auVar21 = maxps(*(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + lVar10) * sVar5),
                      *(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + 4 + lVar10) * sVar5));
      auVar21 = maxps(auVar21,in_XMM4);
      auVar23._0_4_ = auVar21._0_4_ + auVar22._0_4_;
      auVar23._4_4_ = auVar21._4_4_ + auVar22._4_4_;
      auVar23._8_4_ = auVar21._8_4_ + auVar22._8_4_;
      auVar23._12_4_ = auVar21._12_4_ + auVar22._12_4_;
      auVar12 = minps(auVar12,auVar23);
      auVar15 = maxps(auVar15,auVar23);
    }
    auVar21._0_4_ = auVar15._0_4_ - auVar12._0_4_;
    auVar21._4_4_ = auVar15._4_4_ - auVar12._4_4_;
    auVar21._8_4_ = auVar15._8_4_ - auVar12._8_4_;
    auVar21._12_4_ = auVar15._12_4_ - auVar12._12_4_;
    auVar15 = rcpps(in_XMM4,auVar21);
    fVar14 = auVar15._0_4_;
    fVar17 = auVar15._4_4_;
    fVar19 = auVar15._8_4_;
    for (; uVar11 < uVar9; uVar11 = uVar11 + 1) {
      pTVar2 = this->calculateBounds->mesh;
      lVar10 = (ulong)this->morton[uVar11].field_0.field_0.index * *(long *)&pTVar2->field_0x68;
      lVar3 = *(long *)&(pTVar2->super_Geometry).field_0x58;
      pcVar4 = (pTVar2->vertices0).super_RawBufferView.ptr_ofs;
      sVar5 = (pTVar2->vertices0).super_RawBufferView.stride;
      auVar15 = minps(*(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + lVar10) * sVar5),
                      *(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + 4 + lVar10) * sVar5));
      auVar23 = minps(auVar15,*(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + 8 + lVar10) * sVar5)
                     );
      auVar15 = maxps(*(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + lVar10) * sVar5),
                      *(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + 4 + lVar10) * sVar5));
      auVar15 = maxps(auVar15,*(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + 8 + lVar10) * sVar5)
                     );
      uVar13 = (uint)(((auVar15._0_4_ + auVar23._0_4_) - auVar12._0_4_) *
                     (float)((uint)(((1.0 - auVar21._0_4_ * fVar14) * fVar14 + fVar14) * 1013.76) &
                            -(uint)(1e-19 < auVar21._0_4_)));
      uVar16 = (uint)(((auVar15._4_4_ + auVar23._4_4_) - auVar12._4_4_) *
                     (float)((uint)(((1.0 - auVar21._4_4_ * fVar17) * fVar17 + fVar17) * 1013.76) &
                            -(uint)(1e-19 < auVar21._4_4_)));
      uVar18 = (uint)(((auVar15._8_4_ + auVar23._8_4_) - auVar12._8_4_) *
                     (float)((uint)(((1.0 - auVar21._8_4_ * fVar19) * fVar19 + fVar19) * 1013.76) &
                            -(uint)(1e-19 < auVar21._8_4_)));
      this->morton[uVar11].field_0.field_0.code =
           ((((uVar18 << 0x10 | uVar18) & 0x30000ff) * 0x101 & 0x300f00f) * 0x11 & 0x30c30c3) * 0x14
           & 0x24924924 |
           ((((uVar16 << 0x10 | uVar16) & 0x30000ff) * 0x101 & 0x300f00f) * 0x11 & 0x30c30c3) * 10 &
           0x12492492 |
           ((((uVar13 << 0x10 | uVar13) & 0x30000ff) * 0x101 & 0x300f00f) * 0x11 & 0x30c30c3) * 5 &
           0x9249249;
      uVar9 = (ulong)current->_end;
    }
    std::__sort<embree::sse2::BVHBuilderMorton::BuildPrim*,__gnu_cxx::__ops::_Iter_less_iter>
              (this->morton + current->_begin,this->morton + uVar9);
    return;
  }
  mapping.base.field_0._0_8_ = 0x7f8000007f800000;
  mapping.base.field_0._8_8_ = 0x7f8000007f800000;
  mapping.scale.field_0._0_8_ = 0xff800000ff800000;
  mapping.scale.field_0._8_8_ = 0xff800000ff800000;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_108.my_begin = uVar13;
  local_108.my_end = uVar16;
  local_108.my_grainsize = 0x400;
  tbb::detail::d1::
  parallel_reduce<tbb::detail::d1::blocked_range<unsigned_int>,embree::BBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_int,embree::BBox<embree::Vec3fa>,embree::sse2::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create,embree::sse2::SetBVHNBounds<4>,embree::sse2::CreateMortonLeaf<4,embree::TriangleM<4>>,embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,embree::Scene::BuildProgressMonitorInterface>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_1_,embree::BBox<embree::Vec3fa>const(embree::BBox<embree::Vec3fa>const&,embree::BBox<embree::Vec3fa>const&)>(unsigned_int,unsigned_int,unsigned_int,embree::BBox<embree::Vec3fa>const&,embree::sse2::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create,embree::sse2::SetBVHNBounds<4>,embree::sse2::CreateMortonLeaf<4,embree::TriangleM<4>>,embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,embree::Scene::BuildProgressMonitorInterface>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_1_const&,embree::BBox<embree::Vec3fa>const(const&)(embree::BBox<embree::Vec3fa>const&,embree::BBox<embree::Vec3fa>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_int>const&,embree::BBox<embree::Vec3fa>const&)_1_,embree::BBox<embree::Vec3fa>const(embree::BBox<embree::Vec3fa>const&,embree::BBox<embree::Vec3fa>const&)>
            (&centBounds,(d1 *)&local_108,(blocked_range<unsigned_int> *)&mapping,
             (BBox<embree::Vec3fa> *)&stack0xfffffffffffffec8,
             (anon_class_16_2_ed117de8_conflict24 *)BBox<embree::Vec3fa>::merge,
             (_func_BBox<embree::Vec3fa>_BBox<embree::Vec3fa>_ptr_BBox<embree::Vec3fa>_ptr *)
             &context,(task_group_context *)BBox<embree::Vec3fa>::merge);
  cVar6 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar6 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    auVar12._0_4_ = centBounds.upper.field_0.m128[0] - centBounds.lower.field_0.m128[0];
    auVar12._4_4_ = centBounds.upper.field_0.m128[1] - centBounds.lower.field_0.m128[1];
    auVar12._8_4_ = centBounds.upper.field_0.m128[2] - centBounds.lower.field_0.m128[2];
    auVar12._12_4_ = centBounds.upper.field_0.m128[3] - centBounds.lower.field_0.m128[3];
    auVar15 = rcpps(in_XMM2,auVar12);
    fVar14 = auVar15._0_4_;
    fVar17 = auVar15._4_4_;
    fVar19 = auVar15._8_4_;
    fVar20 = auVar15._12_4_;
    mapping.scale.field_0.i[1] =
         (uint)(((1.0 - auVar12._4_4_ * fVar17) * fVar17 + fVar17) * 1013.76) &
         -(uint)(1e-19 < auVar12._4_4_);
    mapping.scale.field_0.i[0] =
         (uint)(((1.0 - auVar12._0_4_ * fVar14) * fVar14 + fVar14) * 1013.76) &
         -(uint)(1e-19 < auVar12._0_4_);
    mapping.scale.field_0.i[3] =
         (uint)(((1.0 - auVar12._12_4_ * fVar20) * fVar20 + fVar20) * 1013.76) &
         -(uint)(1e-19 < auVar12._12_4_);
    mapping.scale.field_0.i[2] =
         (uint)(((1.0 - auVar12._8_4_ * fVar19) * fVar19 + fVar19) * 1013.76) &
         -(uint)(1e-19 < auVar12._8_4_);
    rVar1 = *current;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    local_128.m128[0] = (float)rVar1._begin;
    local_128.m128[1] = (float)rVar1._end;
    local_108.my_begin = (uint)local_128.m128[0];
    local_108.my_end = (uint)local_128.m128[1];
    local_108.my_grainsize = 0x400;
    local_110.func = (anon_class_16_2_00173b7b *)&stack0xfffffffffffffec8;
    tbb::detail::d1::
    parallel_for<tbb::detail::d1::blocked_range<unsigned_int>,embree::parallel_for<unsigned_int,embree::sse2::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create,embree::sse2::SetBVHNBounds<4>,embree::sse2::CreateMortonLeaf<4,embree::TriangleM<4>>,embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,embree::Scene::BuildProgressMonitorInterface>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_2_>(unsigned_int,unsigned_int,unsigned_int,embree::sse2::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create,embree::sse2::SetBVHNBounds<4>,embree::sse2::CreateMortonLeaf<4,embree::TriangleM<4>>,embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,embree::Scene::BuildProgressMonitorInterface>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_2_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_int>const&)_1_>
              (&local_108,&local_110,&context);
    cVar6 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar6 == '\0') {
      tbb::detail::d1::task_group_context::~task_group_context(&context);
      tbb::detail::d1::parallel_sort<embree::sse2::BVHBuilderMorton::BuildPrim*>
                (this->morton + current->_begin,this->morton + current->_end);
      return;
    }
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"task cancelled");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,"task cancelled");
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

__noinline void recreateMortonCodes(const range<unsigned>& current) const
        {
          /* fast path for small ranges */
          if (likely(current.size() < 1024))
          {
            /*! recalculate centroid bounds */
            BBox3fa centBounds(empty);
            for (size_t i=current.begin(); i<current.end(); i++)
              centBounds.extend(center2(calculateBounds(morton[i])));

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            for (size_t i=current.begin(); i<current.end(); i++)
              morton[i].code = mapping.code(calculateBounds(morton[i]));

            /* sort morton codes */
            std::sort(morton+current.begin(),morton+current.end());
          }
          else
          {
            /*! recalculate centroid bounds */
            auto calculateCentBounds = [&] ( const range<unsigned>& r ) {
              BBox3fa centBounds = empty;
              for (size_t i=r.begin(); i<r.end(); i++)
                centBounds.extend(center2(calculateBounds(morton[i])));
              return centBounds;
            };
            const BBox3fa centBounds = parallel_reduce(current.begin(), current.end(), unsigned(1024),
                                                       BBox3fa(empty), calculateCentBounds, BBox3fa::merge);

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            parallel_for(current.begin(), current.end(), unsigned(1024), [&] ( const range<unsigned>& r ) {
                for (size_t i=r.begin(); i<r.end(); i++) {
                  morton[i].code = mapping.code(calculateBounds(morton[i]));
                }
              });

            /*! sort morton codes */
#if defined(TASKING_TBB)
            tbb::parallel_sort(morton+current.begin(),morton+current.end());
#else
            radixsort32(morton+current.begin(),current.size());
#endif
          }
        }